

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deDynamicLibrary.c
# Opt level: O0

deDynamicLibrary * deDynamicLibrary_open(char *fileName)

{
  long lVar1;
  deDynamicLibrary *library;
  char *fileName_local;
  
  fileName_local = (char *)deCalloc(8);
  if ((long *)fileName_local == (long *)0x0) {
    fileName_local = (char *)0x0;
  }
  else {
    lVar1 = dlopen(fileName,1);
    *(long *)fileName_local = lVar1;
    if (*(long *)fileName_local == 0) {
      deFree(fileName_local);
      fileName_local = (char *)0x0;
    }
  }
  return (deDynamicLibrary *)fileName_local;
}

Assistant:

deDynamicLibrary* deDynamicLibrary_open (const char* fileName)
{
	deDynamicLibrary* library = (deDynamicLibrary*)deCalloc(sizeof(deDynamicLibrary));
	if (!library)
		return DE_NULL;

	library->libHandle = dlopen(fileName, RTLD_LAZY);
	if (!library->libHandle)
	{
		deFree(library);
		return DE_NULL;
	}

	return library;
}